

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O3

int Gia_ManConeMark(Gia_Man_t *p,int iOut,int Limit)

{
  bool bVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = p->vCos->nSize;
  if (iVar4 - p->nRegs <= iOut) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((iOut < 0) || (iVar4 <= iOut)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = p->vCos->pArray[(uint)iOut];
  if ((iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00718762:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  Vec_IntPush(p_00,iVar4);
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  iVar4 = p_00->nSize;
  if (0 < iVar4) {
    lVar5 = 1;
    while( true ) {
      iVar2 = p_00->pArray[lVar5 + -1];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00718762;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ManConeMark_rec(p,p->pObjs + iVar2,p_00,Limit);
      iVar4 = p_00->nSize;
      if ((iVar2 != 0) || (bVar1 = iVar4 <= lVar5, lVar5 = lVar5 + 1, bVar1)) break;
    }
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return iVar4 + -1;
}

Assistant:

int Gia_ManConeMark( Gia_Man_t * p, int iOut, int Limit )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, RetValue;
    // start the outputs
    pObj = Gia_ManPo( p, iOut );
    vRoots = Vec_IntAlloc( 100 );
    Vec_IntPush( vRoots, Gia_ObjId(p, pObj) );
    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        if ( Gia_ManConeMark_rec( p, pObj, vRoots, Limit ) )
            break;
    RetValue = Vec_IntSize( vRoots ) - 1;
    Vec_IntFree( vRoots );
    return RetValue;
}